

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  urlpieces *part;
  undefined1 *puVar1;
  char **ppcVar2;
  char **passwordp;
  char **ppcVar3;
  curl_slist *pcVar4;
  altsvcinfo *asi;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  void *pvVar8;
  curl_proxytype proxytype;
  undefined4 uVar9;
  _Bool _Var10;
  uchar uVar11;
  byte bVar12;
  ushort uVar13;
  CURLUcode CVar14;
  int iVar15;
  CURLcode CVar16;
  CURLcode CVar17;
  resolve_t rVar18;
  connectdata *conn;
  ulong uVar19;
  char *pcVar20;
  CURLU *u;
  size_t sVar21;
  size_t sVar22;
  stsentry *psVar23;
  Curl_handler *pCVar24;
  long lVar25;
  ulong uVar26;
  char *pcVar27;
  timediff_t tVar28;
  Curl_dns_entry *pCVar29;
  Curl_addrinfo *pCVar30;
  curl_trc_feat *pcVar31;
  byte bVar32;
  uint uVar33;
  ConnectBits CVar34;
  byte bVar35;
  ulong uVar36;
  CURLcode CVar37;
  char *pcVar38;
  byte *pbVar39;
  char **ppcVar40;
  connectdata *conn_00;
  char *pcVar41;
  hostname *host;
  byte *__s;
  bool bVar42;
  curltime cVar43;
  curltime newer;
  curltime older;
  curl_slist **local_a0;
  proxy_info *local_90;
  char *newurl;
  Curl_easy *pCStack_80;
  connectdata *local_78;
  ulong uStack_70;
  byte *local_60;
  hostname *local_58;
  _Bool *local_50;
  hostname *local_48;
  _Bool *local_40;
  char *local_38;
  
  *asyncp = false;
  Curl_req_hard_reset(&data->req,data);
  *asyncp = false;
  if ((data->state).url == (char *)0x0) {
    return CURLE_URL_MALFORMAT;
  }
  conn = (connectdata *)(*Curl_ccalloc)(1,0x588);
  if (conn == (connectdata *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  conn->sock[0] = -1;
  conn->sock[1] = -1;
  conn->sockfd = -1;
  conn->writesockfd = -1;
  conn->connection_id = -1;
  (conn->primary).remote_port = -1;
  conn->remote_port = -1;
  CVar16 = CURLE_UNSUPPORTED_PROTOCOL;
  Curl_conncontrol(conn,1);
  cVar43 = Curl_now();
  (conn->created).tv_sec = cVar43.tv_sec;
  (conn->created).tv_usec = cVar43.tv_usec;
  (conn->keepalive).tv_sec = (conn->created).tv_sec;
  (conn->keepalive).tv_usec = (conn->created).tv_usec;
  *(undefined4 *)&(conn->keepalive).field_0xc = *(undefined4 *)&(conn->created).field_0xc;
  bVar12 = (data->set).proxytype;
  (conn->http_proxy).proxytype = bVar12;
  (conn->socks_proxy).proxytype = '\x04';
  pcVar20 = (data->set).str[0x26];
  if ((pcVar20 == (char *)0x0) || (*pcVar20 == '\0')) {
    uVar19 = 0;
    uVar26 = 0;
    uVar36 = 0;
  }
  else {
    uVar26 = 0x10;
    uVar19 = (ulong)(bVar12 < 4);
    uVar36 = (ulong)((uint)(bVar12 >= 4) * 2);
  }
  CVar34 = (ConnectBits)((ulong)conn->bits & 0xffffffffffffffec | uVar19 | uVar26 | uVar36);
  conn->bits = CVar34;
  pcVar20 = (data->set).str[0x27];
  if ((pcVar20 != (char *)0x0) && (*pcVar20 != '\0')) {
    CVar34 = (ConnectBits)((ulong)CVar34 | 0x12);
    conn->bits = CVar34;
  }
  CVar34 = (ConnectBits)
           (((ulong)CVar34 & 0xfffffffffffffffb) +
           (ulong)((data->state).aptr.proxyuser != (char *)0x0) * 4);
  conn->bits = CVar34;
  uVar26 = (ulong)(*(uint *)&(data->set).field_0x8ca >> 5 & 8);
  conn->bits = (ConnectBits)((ulong)CVar34 & 0xfffffffffffffff7 | uVar26);
  CVar34 = (ConnectBits)
           (((ulong)CVar34 & 0xffffffffffff7ff7 | uVar26) +
           (ulong)(*(uint *)&(data->set).field_0x8ca & 0x2000) * 4);
  conn->bits = CVar34;
  conn->bits = (ConnectBits)
               (((ulong)CVar34 & 0xfffffffffffeffff) +
               (ulong)(*(uint *)&(data->set).field_0x8ca & 0x4000) * 4);
  conn->ip_version = (data->set).ipver;
  conn->connect_only = (data->set).connect_only;
  conn->transport = '\x03';
  Curl_llist_init(&conn->easyq,(Curl_llist_dtor)0x0);
  pcVar20 = (data->set).str[0x1e];
  if (pcVar20 != (char *)0x0) {
    pcVar20 = (*Curl_cstrdup)(pcVar20);
    conn->localdev = pcVar20;
    if (pcVar20 == (char *)0x0) {
      (*Curl_cfree)((void *)0x0);
      (*Curl_cfree)(conn);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  conn->localportrange = (data->set).localportrange;
  conn->localport = (data->set).localport;
  pvVar8 = (data->set).closesocket_client;
  conn->fclosesocket = (data->set).fclosesocket;
  conn->closesocket_client = pvVar8;
  iVar15 = (conn->created).tv_usec;
  uVar9 = *(undefined4 *)&(conn->created).field_0xc;
  (conn->lastused).tv_sec = (conn->created).tv_sec;
  (conn->lastused).tv_usec = iVar15;
  *(undefined4 *)&(conn->lastused).field_0xc = uVar9;
  conn->gssapi_delegation = (data->set).gssapi_delegation;
  if ((data->set).uh == (CURLU *)0x0) {
    bVar42 = false;
  }
  else {
    bVar42 = ((data->state).field_0x744 & 2) == 0;
  }
  local_50 = asyncp;
  local_40 = protocol_done;
  up_free(data);
  if (bVar42) {
    u = curl_url_dup((data->set).uh);
  }
  else {
    u = curl_url();
  }
  (data->state).uh = u;
  CVar17 = CURLE_OUT_OF_MEMORY;
  if (u == (CURLU *)0x0) goto switchD_00159d71_caseD_5;
  if (((data->set).str[0x1d] != (char *)0x0) &&
     (sVar21 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar21 == 0)) {
    pcVar20 = curl_maprintf("%s://%s",(data->set).str[0x1d],(data->state).url);
    if (pcVar20 != (char *)0x0) {
      uVar33 = *(uint *)&(data->state).field_0x744;
      if ((uVar33 >> 0xe & 1) != 0) {
        (*Curl_cfree)((data->state).url);
        uVar33 = *(uint *)&(data->state).field_0x744;
      }
      (data->state).url = pcVar20;
      *(uint *)&(data->state).field_0x744 = uVar33 | 0x4000;
      goto LAB_00159d32;
    }
    goto switchD_00159d71_caseD_7;
  }
LAB_00159d32:
  if (!bVar42) {
    uVar33 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x8ca >> 0x20);
    CVar14 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                          (uVar33 >> 10 & 0x20) + (uVar33 >> 5 & 0x10) + 0x208);
    if (CVar14 == CURLUE_OK) {
      CVar14 = curl_url_get(u,CURLUPART_URL,&newurl,0);
      CVar17 = CURLE_URL_MALFORMAT;
      switch(CVar14) {
      case CURLUE_OK:
        uVar33 = *(uint *)&(data->state).field_0x744;
        if ((uVar33 >> 0xe & 1) != 0) {
          (*Curl_cfree)((data->state).url);
          uVar33 = *(uint *)&(data->state).field_0x744;
        }
        (data->state).url = newurl;
        *(uint *)&(data->state).field_0x744 = uVar33 | 0x4000;
        goto LAB_00159d3b;
      default:
        goto switchD_00159d71_caseD_5;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_00159e6c_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_00159d71_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_00159d71_caseD_8;
      }
    }
    pcVar20 = curl_url_strerror(CVar14);
    Curl_failf(data,"URL rejected: %s",pcVar20);
    if (CVar14 - CURLUE_UNSUPPORTED_SCHEME < 4) {
      CVar17 = *(CURLcode *)(&DAT_00175ab4 + (ulong)(CVar14 - CURLUE_UNSUPPORTED_SCHEME) * 4);
      goto switchD_00159d71_caseD_5;
    }
    goto switchD_0015a17a_caseD_6;
  }
LAB_00159d3b:
  part = &(data->state).up;
  CVar17 = CURLE_UNSUPPORTED_PROTOCOL;
  CVar14 = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
  switch(CVar14) {
  case CURLUE_OK:
    ppcVar2 = &(data->state).up.hostname;
    CVar14 = curl_url_get(u,CURLUPART_HOST,ppcVar2,0);
    if (CVar14 == CURLUE_OK) {
      pcVar20 = *ppcVar2;
      sVar22 = strlen(pcVar20);
      if (0xffff < sVar22) {
        Curl_failf(data,"Too long hostname (maximum is %d)",0xffff);
        goto switchD_00159d71_caseD_1;
      }
    }
    else {
      iVar15 = curl_strequal("file",part->scheme);
      if (iVar15 == 0) goto switchD_00159d71_caseD_7;
      pcVar20 = *ppcVar2;
    }
    if (pcVar20 == (char *)0x0) {
      pcVar41 = (char *)0x0;
    }
    else {
      pcVar41 = pcVar20;
      if (*pcVar20 == '[') {
        puVar1 = &(conn->bits).field_0x1;
        *puVar1 = *puVar1 | 4;
        pcVar41 = pcVar20 + 1;
        sVar22 = strlen(pcVar41);
        pcVar20[sVar22] = '\0';
        zonefrom_url(u,data,conn);
      }
    }
    if (pcVar41 == (char *)0x0) {
      pcVar41 = "";
    }
    pcVar20 = (*Curl_cstrdup)(pcVar41);
    (conn->host).rawalloc = pcVar20;
    if (pcVar20 != (char *)0x0) {
      host = &conn->host;
      (conn->host).name = pcVar20;
      CVar16 = Curl_idnconvert_hostname(host);
      if (CVar16 != CURLE_OK) goto LAB_00159f54;
      if (((data->hsts == (hsts *)0x0) || (iVar15 = curl_strequal("http",part->scheme), iVar15 == 0)
          ) || (psVar23 = Curl_hsts(data->hsts,(conn->host).name,true), psVar23 == (stsentry *)0x0))
      {
LAB_0015a0dc:
        pcVar20 = part->scheme;
        pCVar24 = Curl_get_scheme_handler(pcVar20);
        if (pCVar24 == (Curl_handler *)0x0) {
          pcVar41 = "not supported";
        }
        else {
          pcVar41 = "disabled";
          if ((((data->set).allowed_protocols & pCVar24->protocol) != 0) &&
             ((((data->state).field_0x744 & 2) == 0 ||
              (((data->set).redir_protocols & pCVar24->protocol) != 0)))) {
            conn->given = pCVar24;
            conn->handler = pCVar24;
            local_58 = host;
            if ((data->set).str[0x2e] == (char *)0x0) {
              ppcVar2 = &(data->state).up.password;
              CVar14 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar2,0);
              switch(CVar14) {
              case CURLUE_UNSUPPORTED_SCHEME:
                goto switchD_00159d71_caseD_5;
              case CURLUE_URLDECODE:
              case CURLUE_UNKNOWN_PART:
              case CURLUE_NO_SCHEME:
              case CURLUE_NO_USER:
                goto switchD_0015a17a_caseD_6;
              case CURLUE_OUT_OF_MEMORY:
                goto switchD_00159d71_caseD_7;
              case CURLUE_USER_NOT_ALLOWED:
                goto switchD_00159d71_caseD_8;
              case CURLUE_NO_PASSWORD:
                goto switchD_0015a1e8_caseD_c;
              default:
                if (CVar14 != CURLUE_OK) goto switchD_0015a17a_caseD_6;
                CVar16 = Curl_urldecode(*ppcVar2,0,&newurl,(size_t *)0x0,
                                        ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
                if (CVar16 == CURLE_OK) {
                  conn->passwd = newurl;
                  CVar16 = Curl_setstropt(&(data->state).aptr.passwd,newurl);
                  if (CVar16 == CURLE_OK) goto switchD_0015a1e8_caseD_c;
                }
              }
              goto LAB_00159f54;
            }
switchD_0015a1e8_caseD_c:
            if ((data->set).str[0x2d] == (char *)0x0) {
              ppcVar2 = &(data->state).up.user;
              CVar14 = curl_url_get(u,CURLUPART_USER,ppcVar2,0);
              switch(CVar14) {
              case CURLUE_OK:
                CVar16 = Curl_urldecode(*ppcVar2,0,&newurl,(size_t *)0x0,
                                        ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
                if (CVar16 != CURLE_OK) goto LAB_00159f54;
                conn->user = newurl;
                pcVar20 = newurl;
                break;
              default:
                goto switchD_0015a17a_caseD_6;
              case CURLUE_UNSUPPORTED_SCHEME:
                goto switchD_00159d71_caseD_5;
              case CURLUE_OUT_OF_MEMORY:
                goto switchD_00159d71_caseD_7;
              case CURLUE_USER_NOT_ALLOWED:
                goto switchD_00159d71_caseD_8;
              case CURLUE_NO_USER:
                if ((data->state).aptr.passwd == (char *)0x0) goto LAB_0015a148;
                pcVar20 = "";
              }
              CVar16 = Curl_setstropt(&(data->state).aptr.user,pcVar20);
              if (CVar16 != CURLE_OK) goto LAB_00159f54;
            }
LAB_0015a148:
            ppcVar2 = &(data->state).up.options;
            CVar14 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar2,0x40);
            switch(CVar14) {
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_00159d71_caseD_5;
            case CURLUE_URLDECODE:
            case CURLUE_UNKNOWN_PART:
            case CURLUE_NO_SCHEME:
            case CURLUE_NO_USER:
            case CURLUE_NO_PASSWORD:
switchD_0015a17a_caseD_6:
              CVar17 = CURLE_URL_MALFORMAT;
              goto switchD_00159d71_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              break;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_00159d71_caseD_8;
            case CURLUE_NO_OPTIONS:
switchD_0015a17a_caseD_d:
              CVar14 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
              switch(CVar14) {
              case CURLUE_OK:
                CVar14 = curl_url_get(u,CURLUPART_PORT,&(data->state).up.port,1);
                if (CVar14 == CURLUE_OK) {
                  uVar26 = strtoul((data->state).up.port,(char **)0x0,10);
                  uVar13 = (data->set).use_port;
                  if ((uVar13 == 0) || (((data->state).field_0x744 & 0x10) == 0)) {
                    uVar13 = curlx_ultous(uVar26);
                  }
                  conn->remote_port = (uint)uVar13;
                  (conn->primary).remote_port = (uint)uVar13;
                }
                else {
                  iVar15 = curl_strequal("file",part->scheme);
                  if (iVar15 == 0) break;
                }
                curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
                uVar33 = (data->set).scope_id;
                if (uVar33 != 0) {
                  conn->scope_id = uVar33;
                }
                pcVar20 = (data->set).str[0x42];
                if (pcVar20 != (char *)0x0) {
                  pcVar20 = (*Curl_cstrdup)(pcVar20);
                  conn->sasl_authzid = pcVar20;
                  if (pcVar20 == (char *)0x0) break;
                }
                pcVar20 = (data->set).str[0x3c];
                if (pcVar20 != (char *)0x0) {
                  pcVar20 = (*Curl_cstrdup)(pcVar20);
                  conn->oauth_bearer = pcVar20;
                  if (pcVar20 == (char *)0x0) break;
                }
                pcVar20 = (data->set).str[0x3d];
                if (pcVar20 == (char *)0x0) {
                  CVar34 = conn->bits;
                }
                else {
                  pcVar20 = (*Curl_cstrdup)(pcVar20);
                  conn->unix_domain_socket = pcVar20;
                  if (pcVar20 == (char *)0x0) break;
                  CVar34 = (ConnectBits)
                           ((ulong)conn->bits & 0xfffffffffbffffff |
                           (ulong)((uint)(*(ulong *)&(data->set).field_0x8ca >> 0x14) & 0x4000000));
                  conn->bits = CVar34;
                }
                if (((ulong)CVar34 & 4) == 0) {
LAB_0015a4ea:
                  pcVar20 = (data->set).str[0x26];
                  if (pcVar20 == (char *)0x0) {
                    local_a0 = (curl_slist **)0x0;
                  }
                  else {
                    local_a0 = (curl_slist **)(*Curl_cstrdup)(pcVar20);
                    if (local_a0 == (curl_slist **)0x0) {
                      Curl_failf(data,"memory shortage");
                      CVar16 = CURLE_OUT_OF_MEMORY;
                      goto LAB_0015a85c;
                    }
                  }
                  pcVar20 = (data->set).str[0x27];
                  if (pcVar20 == (char *)0x0) {
                    pcVar20 = (char *)0x0;
LAB_0015a572:
                    if ((data->set).str[0x32] == (char *)0x0) {
                      pcVar38 = "no_proxy";
                      pcVar41 = curl_getenv("no_proxy");
                      if (pcVar41 == (char *)0x0) {
                        pcVar38 = "NO_PROXY";
                        pcVar41 = curl_getenv("NO_PROXY");
                        if (pcVar41 == (char *)0x0) goto LAB_0015a580;
                      }
                      if ((((data->set).field_0x8cd & 0x10) != 0) &&
                         ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 ||
                          (0 < pcVar31->log_level)))) {
                        Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar38,pcVar41);
                      }
                    }
                    else {
LAB_0015a580:
                      pcVar41 = (char *)0x0;
                    }
                    pcVar38 = (data->set).str[0x32];
                    if (pcVar38 == (char *)0x0) {
                      pcVar38 = pcVar41;
                    }
                    _Var10 = Curl_check_noproxy((conn->host).name,pcVar38);
                    if (_Var10) {
                      (*Curl_cfree)(local_a0);
                      (*Curl_cfree)(pcVar20);
LAB_0015a5b5:
                      local_a0 = (curl_slist **)0x0;
LAB_0015a5be:
                      pcVar20 = (char *)0x0;
                    }
                    else if (local_a0 == (curl_slist **)0x0 && pcVar20 == (char *)0x0) {
                      pcVar20 = (char *)&newurl;
                      curl_msnprintf(pcVar20,0x14,"%s_proxy",conn->handler->scheme);
                      local_a0 = (curl_slist **)curl_getenv(pcVar20);
                      if (local_a0 == (curl_slist **)0x0) {
                        pcVar20 = (char *)&newurl;
                        iVar15 = curl_strequal("http_proxy",pcVar20);
                        if (iVar15 == 0) {
                          Curl_strntoupper(pcVar20,pcVar20,0x14);
                          local_a0 = (curl_slist **)curl_getenv(pcVar20);
                          if (local_a0 != (curl_slist **)0x0) goto LAB_0015a94c;
                        }
                        pcVar20 = "all_proxy";
                        local_a0 = (curl_slist **)curl_getenv("all_proxy");
                        if (local_a0 == (curl_slist **)0x0) {
                          pcVar20 = "ALL_PROXY";
                          local_a0 = (curl_slist **)curl_getenv("ALL_PROXY");
                          if (local_a0 == (curl_slist **)0x0) goto LAB_0015a5b5;
                        }
                      }
LAB_0015a94c:
                      if ((((data->set).field_0x8cd & 0x10) != 0) &&
                         ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 ||
                          (0 < pcVar31->log_level)))) {
                        Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar20,local_a0);
                      }
                      goto LAB_0015a5be;
                    }
                    (*Curl_cfree)(pcVar41);
                    if (local_a0 == (curl_slist **)0x0) {
LAB_0015a601:
                      local_a0 = (curl_slist **)0x0;
                    }
                    else if (((conn->unix_domain_socket != (char *)0x0) ||
                             (*(char *)local_a0 == '\0')) || ((conn->handler->flags & 0x10) != 0)) {
                      (*Curl_cfree)(local_a0);
                      goto LAB_0015a601;
                    }
                    if (pcVar20 == (char *)0x0) {
LAB_0015a65d:
                      if (local_a0 != (curl_slist **)0x0) {
                        proxytype = (curl_proxytype)(conn->http_proxy).proxytype;
                        pcVar20 = (char *)0x0;
                        local_60 = (byte *)0x0;
LAB_0015a68d:
                        CVar16 = parse_proxy(data,conn,(char *)local_a0,proxytype);
                        (*Curl_cfree)(local_a0);
                        if (CVar16 == CURLE_OK) {
                          if ((char)local_60 != '\0') goto LAB_0015a82a;
                          goto LAB_0015a864;
                        }
                        local_a0 = (curl_slist **)0x0;
                        goto LAB_0015a9f4;
                      }
                      uVar26 = (ulong)conn->bits & 0xfffffffffffffffc;
                    }
                    else {
                      if ((*pcVar20 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
                        (*Curl_cfree)(pcVar20);
                        goto LAB_0015a65d;
                      }
                      proxytype = (curl_proxytype)(conn->http_proxy).proxytype;
                      local_60 = (byte *)0x1;
                      if (local_a0 != (curl_slist **)0x0) goto LAB_0015a68d;
LAB_0015a82a:
                      CVar16 = parse_proxy(data,conn,pcVar20,proxytype);
                      (*Curl_cfree)(pcVar20);
                      if (CVar16 != CURLE_OK) goto LAB_0015a85c;
LAB_0015a864:
                      local_90 = &conn->http_proxy;
                      if ((local_90->host).rawalloc == (char *)0x0) {
                        CVar34 = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffff6);
                        conn->bits = CVar34;
                        if ((conn->socks_proxy).host.rawalloc == (char *)0x0) goto LAB_0015a9a5;
                        if ((conn->socks_proxy).user == (char *)0x0) {
                          pcVar20 = (conn->socks_proxy).passwd;
                          (conn->socks_proxy).user = (conn->http_proxy).user;
                          (conn->http_proxy).user = (char *)0x0;
                          (*Curl_cfree)(pcVar20);
                          (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
                          (conn->http_proxy).passwd = (char *)0x0;
                          CVar34 = conn->bits;
                        }
                      }
                      else {
                        CVar34 = conn->bits;
                        if ((conn->handler->protocol & 3) == 0) {
                          if (((conn->handler->flags & 0x800) == 0) || (((ulong)CVar34 & 8) != 0)) {
                            CVar34 = (ConnectBits)((ulong)CVar34 | 8);
                          }
                          else {
                            conn->handler = &Curl_handler_http;
                          }
                        }
                        CVar34 = (ConnectBits)((ulong)CVar34 | 1);
                        if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
LAB_0015a9a5:
                          uVar26 = (ulong)CVar34 & 0xfffffffffffffffd;
                          goto LAB_0015a9a9;
                        }
                      }
                      uVar26 = (ulong)CVar34 | 2;
                    }
LAB_0015a9a9:
                    uVar19 = 0x10;
                    if ((uVar26 & 1) == 0) {
                      uVar19 = (ulong)((int)uVar26 * 8 & 0x10);
                    }
                    conn->bits = (ConnectBits)(uVar26 & 0xffffffffffffffef | uVar19);
                    if (uVar19 == 0) {
                      conn->bits = (ConnectBits)(uVar26 & 0xffffffffffffffe0);
                      (conn->http_proxy).proxytype = '\0';
                    }
                    local_a0 = (curl_slist **)0x0;
                    pcVar20 = (char *)0x0;
                    CVar16 = CURLE_OK;
                  }
                  else {
                    pcVar20 = (*Curl_cstrdup)(pcVar20);
                    if (pcVar20 != (char *)0x0) goto LAB_0015a572;
                    pcVar20 = (char *)0x0;
                    Curl_failf(data,"memory shortage");
                    CVar16 = CURLE_OUT_OF_MEMORY;
                  }
                }
                else {
                  pcVar20 = (data->state).aptr.proxyuser;
                  pcVar41 = (data->state).aptr.proxypasswd;
                  if (pcVar20 == (char *)0x0) {
                    pcVar20 = "";
                  }
                  pcVar20 = (*Curl_cstrdup)(pcVar20);
                  (conn->http_proxy).user = pcVar20;
                  CVar16 = CURLE_OUT_OF_MEMORY;
                  if (pcVar20 != (char *)0x0) {
                    if (pcVar41 == (char *)0x0) {
                      pcVar41 = "";
                    }
                    pcVar20 = (*Curl_cstrdup)(pcVar41);
                    (conn->http_proxy).passwd = pcVar20;
                    if (pcVar20 != (char *)0x0) goto LAB_0015a4ea;
                    (*Curl_cfree)((conn->http_proxy).user);
                    (conn->http_proxy).user = (char *)0x0;
                  }
LAB_0015a85c:
                  local_a0 = (curl_slist **)0x0;
                  pcVar20 = (char *)0x0;
                }
LAB_0015a9f4:
                (*Curl_cfree)(pcVar20);
                (*Curl_cfree)(local_a0);
                if (CVar16 != CURLE_OK) goto LAB_00159f54;
                if (((conn->given->flags & 1) != 0) && (((ulong)conn->bits & 1) != 0)) {
                  conn->bits = (ConnectBits)((ulong)conn->bits | 8);
                }
                uVar13 = (data->set).use_port;
                if ((uVar13 != 0) && (((data->state).field_0x744 & 0x10) != 0)) {
                  conn->remote_port = (uint)uVar13;
                  curl_msnprintf((char *)&newurl,0x10,"%d");
                  CVar14 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)&newurl,0);
                  if (CVar14 != CURLUE_OK) break;
                }
                if ((data->set).str[0x2f] != (char *)0x0) {
                  (*Curl_cfree)(conn->options);
                  pcVar20 = (*Curl_cstrdup)((data->set).str[0x2f]);
                  conn->options = pcVar20;
                  if (pcVar20 == (char *)0x0) break;
                }
                ppcVar2 = &conn->user;
                passwordp = &conn->passwd;
                if ((data->set).use_netrc == '\x02') {
                  (*Curl_cfree)(*ppcVar2);
                  *ppcVar2 = (char *)0x0;
                  (*Curl_cfree)(*passwordp);
                  *passwordp = (char *)0x0;
                }
                puVar1 = &(conn->bits).field_0x2;
                *puVar1 = *puVar1 & 0xf7;
                ppcVar40 = ppcVar2;
                if (((data->set).use_netrc == '\0') || ((data->set).str[0x2d] != (char *)0x0)) {
                  pcVar20 = *ppcVar2;
                  if (pcVar20 != (char *)0x0) goto LAB_0015ab35;
                }
                else {
                  ppcVar3 = &(data->state).aptr.user;
                  pcVar20 = (data->state).aptr.user;
                  ppcVar40 = ppcVar3;
                  if (pcVar20 == (char *)0x0) {
                    ppcVar40 = ppcVar2;
                  }
                  iVar15 = Curl_parsenetrc((conn->host).name,ppcVar40,passwordp,
                                           (data->set).str[0x25]);
                  if (iVar15 < 1) {
                    if (iVar15 < 0) {
                      Curl_failf(data,".netrc parser error");
                      CVar17 = CURLE_READ_ERROR;
                      goto switchD_00159d71_caseD_5;
                    }
                    puVar1 = &(conn->bits).field_0x2;
                    *puVar1 = *puVar1 | 8;
                  }
                  else if ((((data->set).field_0x8cd & 0x10) != 0) &&
                          ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 ||
                           (0 < pcVar31->log_level)))) {
                    pcVar41 = (data->set).str[0x25];
                    pcVar38 = ".netrc";
                    if (pcVar41 != (char *)0x0) {
                      pcVar38 = pcVar41;
                    }
                    Curl_infof(data,"Couldn\'t find host %s in the %s file; using defaults",
                               (conn->host).name,pcVar38);
                  }
                  if (pcVar20 != (char *)0x0) {
                    (*Curl_cfree)(*ppcVar2);
                    *ppcVar2 = (char *)0x0;
                    pcVar20 = (*Curl_cstrdup)(*ppcVar3);
                    *ppcVar2 = pcVar20;
                    if (pcVar20 == (char *)0x0) break;
                  }
                  pcVar20 = *ppcVar40;
                  if (pcVar20 == (char *)0x0) {
                    if (*passwordp == (char *)0x0) goto LAB_0015ab52;
                    pcVar20 = (*Curl_cstrdup)("");
                    *ppcVar40 = pcVar20;
                    if (pcVar20 == (char *)0x0) break;
                  }
LAB_0015ab35:
                  if (((data->state).aptr.user != pcVar20) &&
                     (CVar16 = Curl_setstropt(&(data->state).aptr.user,pcVar20), CVar16 != CURLE_OK)
                     ) goto LAB_00159f54;
                }
LAB_0015ab52:
                pcVar20 = (data->state).aptr.user;
                CVar17 = CURLE_UNSUPPORTED_PROTOCOL;
                if (pcVar20 != (char *)0x0) {
                  CVar14 = curl_url_set((data->state).uh,CURLUPART_USER,pcVar20,0x80);
                  switch(CVar14) {
                  case CURLUE_OK:
                    if (*ppcVar40 == (char *)0x0) {
                      pcVar20 = (*Curl_cstrdup)((data->state).aptr.user);
                      *ppcVar40 = pcVar20;
                      if (pcVar20 == (char *)0x0) goto switchD_00159d71_caseD_7;
                    }
                    break;
                  default:
                    goto switchD_0015a17a_caseD_6;
                  case CURLUE_UNSUPPORTED_SCHEME:
                    goto switchD_00159d71_caseD_5;
                  case CURLUE_OUT_OF_MEMORY:
                    goto switchD_00159d71_caseD_7;
                  case CURLUE_USER_NOT_ALLOWED:
                    goto switchD_00159d71_caseD_8;
                  }
                }
                if ((*passwordp != (char *)0x0) &&
                   (CVar16 = Curl_setstropt(&(data->state).aptr.passwd,*passwordp),
                   CVar16 != CURLE_OK)) goto LAB_00159f54;
                pcVar20 = (data->state).aptr.passwd;
                if (pcVar20 != (char *)0x0) {
                  CVar14 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,pcVar20,0x80);
                  switch(CVar14) {
                  case CURLUE_OK:
                    if (*passwordp == (char *)0x0) {
                      pcVar20 = (*Curl_cstrdup)((data->state).aptr.passwd);
                      *passwordp = pcVar20;
                      if (pcVar20 == (char *)0x0) goto switchD_00159d71_caseD_7;
                    }
                    goto LAB_0015ac2e;
                  default:
                    CVar17 = CURLE_URL_MALFORMAT;
                    break;
                  case CURLUE_UNSUPPORTED_SCHEME:
                    break;
                  case CURLUE_OUT_OF_MEMORY:
                    goto switchD_00159d71_caseD_7;
                  case CURLUE_USER_NOT_ALLOWED:
                    goto switchD_00159d71_caseD_8;
                  }
                  goto switchD_00159d71_caseD_5;
                }
LAB_0015ac2e:
                if (((conn->handler->flags & 0x20) == 0) || ((data->state).aptr.user != (char *)0x0)
                   ) {
                  pcVar41 = "";
                  pcVar20 = "";
                }
                else {
                  pcVar41 = "ftp@example.com";
                  pcVar20 = "anonymous";
                }
                if (*ppcVar2 == (char *)0x0) {
                  pcVar20 = (*Curl_cstrdup)(pcVar20);
                  *ppcVar2 = pcVar20;
                  if (pcVar20 == (char *)0x0) break;
                }
                if (*passwordp == (char *)0x0) {
                  pcVar20 = (*Curl_cstrdup)(pcVar41);
                  *passwordp = pcVar20;
                  if (pcVar20 == (char *)0x0) break;
                }
                local_a0 = &(data->set).connect_to;
                local_48 = &conn->conn_to_host;
                CVar37 = CURLE_OUT_OF_MEMORY;
                pcVar20 = (char *)0x0;
                uVar26 = 0xffffffff;
LAB_0015acbd:
                CVar17 = CVar37;
                if ((((int)uVar26 == -1) && (pcVar20 == (char *)0x0)) &&
                   (pcVar4 = *local_a0, pcVar4 != (curl_slist *)0x0)) {
                  pcVar20 = pcVar4->data;
                  if (*pcVar20 == ':') {
LAB_0015ad7e:
                    if (pcVar20[1] != ':') {
                      pcVar41 = strchr(pcVar20 + 1,0x3a);
                      if (pcVar41 != (char *)0x0) {
                        newurl = (char *)0x0;
                        lVar25 = strtol(pcVar20 + 1,&newurl,10);
                        if ((newurl == pcVar41) && (lVar25 == conn->remote_port)) {
                          pcVar20 = pcVar41 + 1;
                          goto LAB_0015ad8d;
                        }
                      }
                      goto LAB_0015ae5f;
                    }
                    pcVar20 = pcVar20 + 2;
LAB_0015ad8d:
                    if (*pcVar20 == '\0') goto LAB_0015ae5f;
                    local_60 = (byte *)(*Curl_cstrdup)(pcVar20);
                    if (local_60 != (byte *)0x0) {
                      __s = local_60;
                      local_90 = (proxy_info *)local_60;
                      if (*local_60 == 0x5b) {
                        pbVar39 = local_60 + 2;
                        local_90 = (proxy_info *)(local_60 + 1);
                        for (__s = (byte *)local_90; bVar12 = *__s, bVar12 != 0; __s = __s + 1) {
                          if ((9 < (byte)(bVar12 - 0x30)) &&
                             ((0x38 < bVar12 - 0x2e ||
                              ((0x1f8000001f81001U >> ((ulong)(bVar12 - 0x2e) & 0x3f) & 1) == 0))))
                          {
                            if (bVar12 != 0x25) goto LAB_0015af65;
                            if (__s[1] - 0x32 == 0) {
                              iVar15 = 0x35 - (uint)__s[2];
                            }
                            else {
                              iVar15 = -(__s[1] - 0x32);
                            }
                            if (((iVar15 != 0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                               ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 ||
                                (0 < pcVar31->log_level)))) {
                              Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.");
                            }
                            goto LAB_0015af28;
                          }
                          pbVar39 = pbVar39 + 1;
                        }
                        goto LAB_0015af72;
                      }
                      goto LAB_0015af9e;
                    }
                  }
                  else {
                    bVar42 = (*(uint *)&conn->bits >> 10 & 1) == 0;
                    pcVar41 = "[";
                    if (bVar42) {
                      pcVar41 = "";
                    }
                    pcVar38 = "]";
                    if (bVar42) {
                      pcVar38 = "";
                    }
                    pcVar41 = curl_maprintf("%s%s%s",pcVar41,(conn->host).name,pcVar38);
                    if (pcVar41 != (char *)0x0) {
                      sVar22 = strlen(pcVar41);
                      iVar15 = curl_strnequal(pcVar20,pcVar41,sVar22);
                      local_60 = (byte *)CONCAT44(local_60._4_4_,iVar15);
                      (*Curl_cfree)(pcVar41);
                      if (((int)local_60 != 0) && (pcVar20[sVar22] == ':')) {
                        pcVar20 = pcVar20 + sVar22;
                        goto LAB_0015ad7e;
                      }
LAB_0015ae5f:
                      pcVar20 = (char *)0x0;
                      uVar26 = 0xffffffff;
                      goto LAB_0015ae68;
                    }
                  }
                  goto switchD_00159d71_caseD_5;
                }
                if (((((int)uVar26 == -1) && (pcVar20 == (char *)0x0)) &&
                    (asi = data->asi, asi != (altsvcinfo *)0x0)) && (conn->handler->protocol == 2))
                {
                  pcVar20 = (conn->host).rawalloc;
                  _Var10 = Curl_altsvc_lookup(asi,ALPN_h1,pcVar20,conn->remote_port,
                                              (altsvc **)&newurl,(uint)asi->flags & 8);
                  if (_Var10) {
                    pcVar41 = (*Curl_cstrdup)(*(char **)(newurl + 0x10));
                    if (pcVar41 == (char *)0x0) goto switchD_00159d71_caseD_5;
                    (conn->conn_to_host).rawalloc = pcVar41;
                    (conn->conn_to_host).name = pcVar41;
                    CVar34 = conn->bits;
                    conn->bits = (ConnectBits)((ulong)CVar34 | 0x100);
                    conn->conn_to_port = (uint)*(ushort *)(newurl + 0x18);
                    conn->bits = (ConnectBits)((ulong)CVar34 | 0x380);
                    if ((((data->set).field_0x8cd & 0x10) != 0) &&
                       ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar31->log_level)))) {
                      pcVar38 = Curl_alpnid2str(ALPN_h1);
                      uVar33 = conn->remote_port;
                      pcVar27 = Curl_alpnid2str(*(alpnid *)(newurl + 0x1c));
                      Curl_infof(data,"Alt-svc connecting from [%s]%s:%d to [%s]%s:%d",pcVar38,
                                 pcVar20,(ulong)uVar33,pcVar27,pcVar41,
                                 (ulong)*(ushort *)(newurl + 0x18));
                    }
                    if (*(int *)(newurl + 0x1c) == 0x10) {
                      uVar11 = '\x14';
                    }
                    else {
                      if (*(int *)(newurl + 0x1c) != 0x20) goto LAB_0015b39b;
                      conn->transport = '\x05';
                      uVar11 = '\x1e';
                    }
                    conn->httpversion = uVar11;
                  }
                }
LAB_0015b39b:
                CVar34 = conn->bits;
                if (((ulong)CVar34 & 1) != 0) {
                  CVar16 = Curl_idnconvert_hostname(&(conn->http_proxy).host);
                  if (CVar16 != CURLE_OK) goto LAB_00159f54;
                  CVar34 = conn->bits;
                }
                if (((ulong)CVar34 & 2) != 0) {
                  CVar16 = Curl_idnconvert_hostname(&(conn->socks_proxy).host);
                  if (CVar16 != CURLE_OK) goto LAB_00159f54;
                  CVar34 = conn->bits;
                }
                if ((CVar34._0_4_ >> 8 & 1) != 0) {
                  CVar16 = Curl_idnconvert_hostname(local_48);
                  if (CVar16 != CURLE_OK) goto LAB_00159f54;
                  CVar34 = conn->bits;
                  if ((CVar34._0_4_ >> 8 & 1) != 0) {
                    iVar15 = curl_strequal((conn->conn_to_host).name,(conn->host).name);
                    CVar34 = conn->bits;
                    if (iVar15 != 0) {
                      CVar34 = (ConnectBits)((ulong)CVar34 & 0xfffffffffffffeff);
                      conn->bits = CVar34;
                    }
                  }
                }
                if (((CVar34._0_4_ >> 9 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
                  CVar34 = (ConnectBits)((ulong)CVar34 & 0xfffffffffffffdff);
                  conn->bits = CVar34;
                }
                if (((ulong)CVar34 & 1) != 0 && ((ulong)CVar34 & 0x300) != 0) {
                  conn->bits = (ConnectBits)((ulong)CVar34 | 8);
                }
                pCVar24 = conn->handler;
                if (pCVar24->setup_connection != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0
                   ) {
                  CVar16 = (*pCVar24->setup_connection)(data,conn);
                  if (CVar16 != CURLE_OK) goto LAB_00159f54;
                  pCVar24 = conn->handler;
                }
                uVar33 = (conn->primary).remote_port;
                if ((int)uVar33 < 0) {
                  uVar33 = pCVar24->defport;
                  (conn->primary).remote_port = uVar33;
                }
                uVar26 = (ulong)uVar33;
                uVar33 = SUB84(conn->bits,0);
                lVar25 = 0xf0;
                if ((uVar33 & 9) != 1) {
                  uVar26 = (ulong)(uint)conn->remote_port;
                  lVar25 = 0x98;
                  if ((uVar33 >> 8 & 1) == 0) {
                    lVar25 = 0x68;
                  }
                }
                pcVar20 = curl_maprintf("%u/%d/%s",(ulong)conn->scope_id,uVar26,
                                        *(undefined8 *)((long)&(conn->cpool_node)._list + lVar25));
                conn->destination = pcVar20;
                if (pcVar20 == (char *)0x0) goto switchD_00159d71_caseD_5;
                sVar22 = strlen(pcVar20);
                conn->destination_len = sVar22 + 1;
                Curl_strntolower(pcVar20,pcVar20,sVar22);
                pCVar24 = conn->handler;
                if ((pCVar24->flags & 0x10) == 0) {
                  conn->recv[0] = Curl_cf_recv;
                  conn->send[0] = Curl_cf_send;
                  conn->recv[1] = Curl_cf_recv;
                  conn->send[1] = Curl_cf_send;
                  conn->bits = (ConnectBits)
                               ((ulong)conn->bits & 0xffffffffff7fffff |
                               (ulong)((uint)((ulong)*(undefined8 *)&(data->set).field_0x8ca >> 0x10
                                             ) & 0x800000));
                  CVar16 = Curl_ssl_easy_config_complete(data);
                  if (CVar16 != CURLE_OK) goto LAB_00159f54;
                  Curl_cpool_prune_dead(data);
                  if (((((data->set).field_0x8cd & 0x40) == 0) ||
                      ((data->state).followlocation != 0)) && ((data->set).connect_only == '\0')) {
                    newurl = (char *)0x0;
                    uStack_70 = 0;
                    pCStack_80 = data;
                    local_78 = conn;
                    if ((((conn->handler->protocol & 3) == 0) ||
                        ((~*(uint *)&conn->bits & 0x2020) == 0)) ||
                       ((_Var10 = Curl_multiplex_wanted(data->multi), !_Var10 ||
                        (bVar12 = 1, (data->state).httpwant < 3)))) {
                      bVar12 = 0;
                    }
                    if (((data->state).authhost.want & 8) == 0) {
                      bVar32 = 0;
                    }
                    else {
                      bVar32 = ((conn->handler->protocol & 3) != 0) * '\x02';
                    }
                    if ((((ulong)conn->bits & 4) == 0) || (((data->state).authproxy.want & 8) == 0))
                    {
                      bVar35 = 0;
                    }
                    else {
                      bVar35 = ((conn->handler->protocol & 3) != 0) << 2;
                    }
                    uStack_70 = CONCAT71(uStack_70._1_7_,bVar32 | bVar12 | bVar35);
                    _Var10 = Curl_cpool_find(data,conn->destination,conn->destination_len,
                                             url_match_conn,url_match_result,&newurl);
                    conn_00 = (connectdata *)newurl;
                    if (!_Var10) {
                      uVar26 = uStack_70 >> 3 & 0x1f;
                      goto LAB_0015b583;
                    }
                    pcVar20 = newurl;
                    if (*ppcVar2 != (char *)0x0) {
                      (*Curl_cfree)(*(void **)(newurl + 0x1e0));
                      pcVar20[0x1e0] = '\0';
                      pcVar20[0x1e1] = '\0';
                      pcVar20[0x1e2] = '\0';
                      pcVar20[0x1e3] = '\0';
                      pcVar20[0x1e4] = '\0';
                      pcVar20[0x1e5] = '\0';
                      pcVar20[0x1e6] = '\0';
                      pcVar20[0x1e7] = '\0';
                      (*Curl_cfree)(*(void **)((long)conn_00 + 0x1e8));
                      pcVar20[0x1e8] = '\0';
                      pcVar20[0x1e9] = '\0';
                      pcVar20[0x1ea] = '\0';
                      pcVar20[0x1eb] = '\0';
                      pcVar20[0x1ec] = '\0';
                      pcVar20[0x1ed] = '\0';
                      pcVar20[0x1ee] = '\0';
                      pcVar20[0x1ef] = '\0';
                      pcVar41 = conn->passwd;
                      *(char **)((long)conn_00 + 0x1e0) = *ppcVar2;
                      *(char **)((long)conn_00 + 0x1e8) = pcVar41;
                      *ppcVar2 = (char *)0x0;
                      conn->passwd = (char *)0x0;
                    }
                    uVar26 = (ulong)(SUB84(conn->bits,0) & 4);
                    *(ulong *)((long)conn_00 + 0x3b8) =
                         *(ulong *)((long)conn_00 + 0x3b8) & 0xfffffffffffffffb | uVar26;
                    if (uVar26 != 0) {
                      (*Curl_cfree)(*(void **)((long)conn_00 + 0x108));
                      pcVar20[0x108] = '\0';
                      pcVar20[0x109] = '\0';
                      pcVar20[0x10a] = '\0';
                      pcVar20[0x10b] = '\0';
                      pcVar20[0x10c] = '\0';
                      pcVar20[0x10d] = '\0';
                      pcVar20[0x10e] = '\0';
                      pcVar20[0x10f] = '\0';
                      (*Curl_cfree)(*(void **)((long)conn_00 + 0xd0));
                      pcVar20[0xd0] = '\0';
                      pcVar20[0xd1] = '\0';
                      pcVar20[0xd2] = '\0';
                      pcVar20[0xd3] = '\0';
                      pcVar20[0xd4] = '\0';
                      pcVar20[0xd5] = '\0';
                      pcVar20[0xd6] = '\0';
                      pcVar20[0xd7] = '\0';
                      (*Curl_cfree)(*(void **)((long)conn_00 + 0x110));
                      pcVar20[0x110] = '\0';
                      pcVar20[0x111] = '\0';
                      pcVar20[0x112] = '\0';
                      pcVar20[0x113] = '\0';
                      pcVar20[0x114] = '\0';
                      pcVar20[0x115] = '\0';
                      pcVar20[0x116] = '\0';
                      pcVar20[0x117] = '\0';
                      (*Curl_cfree)(*(void **)((long)conn_00 + 0xd8));
                      pcVar20[0xd8] = '\0';
                      pcVar20[0xd9] = '\0';
                      pcVar20[0xda] = '\0';
                      pcVar20[0xdb] = '\0';
                      pcVar20[0xdc] = '\0';
                      pcVar20[0xdd] = '\0';
                      pcVar20[0xde] = '\0';
                      pcVar20[0xdf] = '\0';
                      pcVar41 = (conn->http_proxy).passwd;
                      *(char **)((long)conn_00 + 0x108) = (conn->http_proxy).user;
                      *(char **)((long)conn_00 + 0x110) = pcVar41;
                      pcVar41 = (conn->socks_proxy).passwd;
                      *(char **)((long)conn_00 + 0xd0) = (conn->socks_proxy).user;
                      *(char **)((long)conn_00 + 0xd8) = pcVar41;
                      (conn->socks_proxy).user = (char *)0x0;
                      (conn->socks_proxy).passwd = (char *)0x0;
                      (conn->http_proxy).user = (char *)0x0;
                      (conn->http_proxy).passwd = (char *)0x0;
                    }
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0x58));
                    pcVar20[0x58] = '\0';
                    pcVar20[0x59] = '\0';
                    pcVar20[0x5a] = '\0';
                    pcVar20[0x5b] = '\0';
                    pcVar20[0x5c] = '\0';
                    pcVar20[0x5d] = '\0';
                    pcVar20[0x5e] = '\0';
                    pcVar20[0x5f] = '\0';
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0x88));
                    pcVar20[0x88] = '\0';
                    pcVar20[0x89] = '\0';
                    pcVar20[0x8a] = '\0';
                    pcVar20[0x8b] = '\0';
                    pcVar20[0x8c] = '\0';
                    pcVar20[0x8d] = '\0';
                    pcVar20[0x8e] = '\0';
                    pcVar20[0x8f] = '\0';
                    pcVar41 = local_58->encalloc;
                    pcVar38 = local_58->name;
                    pcVar27 = local_58->dispname;
                    *(char **)((long)conn_00 + 0x58) = local_58->rawalloc;
                    *(char **)((long)conn_00 + 0x60) = pcVar41;
                    *(char **)((long)conn_00 + 0x68) = pcVar38;
                    *(char **)((long)conn_00 + 0x70) = pcVar27;
                    local_58->rawalloc = (char *)0x0;
                    local_58->encalloc = (char *)0x0;
                    pcVar41 = local_48->rawalloc;
                    pcVar38 = local_48->encalloc;
                    pcVar27 = local_48->dispname;
                    *(char **)((long)conn_00 + 0x98) = local_48->name;
                    *(char **)((long)conn_00 + 0xa0) = pcVar27;
                    *(char **)((long)conn_00 + 0x88) = pcVar41;
                    *(char **)((long)conn_00 + 0x90) = pcVar38;
                    (conn->conn_to_host).rawalloc = (char *)0x0;
                    *(undefined8 *)((long)conn_00 + 0x570) = *(undefined8 *)&conn->remote_port;
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0x78));
                    pcVar20[0x78] = '\0';
                    pcVar20[0x79] = '\0';
                    pcVar20[0x7a] = '\0';
                    pcVar20[0x7b] = '\0';
                    pcVar20[0x7c] = '\0';
                    pcVar20[0x7d] = '\0';
                    pcVar20[0x7e] = '\0';
                    pcVar20[0x7f] = '\0';
                    *(char **)((long)conn_00 + 0x78) = conn->hostname_resolve;
                    conn->hostname_resolve = (char *)0x0;
                    *(byte *)((long)conn_00 + 0x3b8) = *(byte *)((long)conn_00 + 0x3b8) | 0x40;
                    Curl_conn_free(data,conn);
                    if ((((data->set).field_0x8cd & 0x10) != 0) &&
                       ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar31->log_level)))) {
                      pcVar20 = "proxy";
                      if ((*(byte *)((long)conn_00 + 0x3b8) & 0x10) == 0) {
                        pcVar20 = "host";
                      }
                      lVar25 = 0xc0;
                      if (*(long *)((long)conn_00 + 0xb8) == 0) {
                        lVar25 = 0xf8;
                        if (*(long *)((long)conn_00 + 0xf0) == 0) {
                          lVar25 = 0x70;
                        }
                      }
                      Curl_infof(data,"Re-using existing connection with %s %s",pcVar20,
                                 *(undefined8 *)((long)conn_00 + lVar25));
                    }
LAB_0015bb74:
                    Curl_init_do(data,conn_00);
                    CVar17 = setup_range(data);
                    conn = conn_00;
                    if (CVar17 != CURLE_OK) goto switchD_00159d71_caseD_5;
                    if (((ulong)conn_00->bits & 0x40) == 0) {
                      tVar28 = Curl_timeleft(data,(curltime *)0x0,true);
                      pcVar20 = conn_00->unix_domain_socket;
                      if (pcVar20 == (char *)0x0) {
                        CVar34 = conn_00->bits;
                        if (((ulong)CVar34 & 0x10) == 0) {
                          lVar25 = 0x88;
                          if ((CVar34._0_4_ >> 8 & 1) == 0) {
                            lVar25 = 0x58;
                          }
                          (conn_00->primary).remote_port =
                               *(int *)((long)&conn_00->remote_port + (ulong)(CVar34._0_4_ >> 7 & 4)
                                       );
                          pcVar20 = "host";
                        }
                        else {
                          pcVar20 = (conn_00->socks_proxy).host.name;
                          if ((pcVar20 != (char *)0x0) &&
                             (iVar15 = strncmp("localhost/",pcVar20,10), iVar15 == 0)) {
                            pcVar20 = pcVar20 + 9;
                            goto LAB_0015bbce;
                          }
                          lVar25 = 0xa8;
                          if (((ulong)CVar34 & 2) == 0) {
                            lVar25 = 0xe0;
                          }
                          pcVar20 = "proxy";
                        }
                        pcVar41 = (*Curl_cstrdup)(*(char **)((long)&(conn_00->cpool_node)._prev +
                                                            lVar25));
                        conn_00->hostname_resolve = pcVar41;
                        CVar17 = CVar37;
                        if (pcVar41 == (char *)0x0) goto switchD_00159d71_caseD_5;
                        rVar18 = Curl_resolv_timeout(data,pcVar41,(conn_00->primary).remote_port,
                                                     &conn_00->dns_entry,tVar28);
                        if (rVar18 == CURLRESOLV_TIMEDOUT) {
                          uVar5 = *(undefined8 *)((long)&(conn_00->cpool_node)._next + lVar25);
                          cVar43 = Curl_now();
                          uVar6 = (data->progress).t_startsingle.tv_sec;
                          uVar7 = (data->progress).t_startsingle.tv_usec;
                          older.tv_usec = uVar7;
                          older.tv_sec = uVar6;
                          newer._12_4_ = 0;
                          newer.tv_sec = SUB128(cVar43._0_12_,0);
                          newer.tv_usec = SUB124(cVar43._0_12_,8);
                          older._12_4_ = 0;
                          tVar28 = Curl_timediff(newer,older);
                          Curl_failf(data,"Failed to resolve %s \'%s\' with timeout after %ld ms",
                                     pcVar20,uVar5,tVar28);
                          CVar17 = CURLE_OPERATION_TIMEDOUT;
                          goto switchD_00159d71_caseD_5;
                        }
                        if (rVar18 == CURLRESOLV_PENDING) {
                          *local_50 = true;
                        }
                        else if (conn_00->dns_entry == (Curl_dns_entry *)0x0) {
                          Curl_failf(data,"Could not resolve %s: %s",pcVar20,
                                     *(undefined8 *)((long)&(conn_00->cpool_node)._next + lVar25));
                          CVar17 = CURLE_COULDNT_RESOLVE_HOST;
                          goto switchD_00159d71_caseD_5;
                        }
                      }
                      else {
LAB_0015bbce:
                        conn_00->transport = '\x06';
                        newurl = (char *)((ulong)newurl & 0xffffffffffffff00);
                        pCVar29 = (Curl_dns_entry *)(*Curl_ccalloc)(1,0x20);
                        if (pCVar29 == (Curl_dns_entry *)0x0) break;
                        pCVar30 = Curl_unix2addr(pcVar20,(_Bool *)&newurl,
                                                 (_Bool)((byte)((uint)*(undefined4 *)&conn_00->bits
                                                               >> 0x1a) & 1));
                        pCVar29->addr = pCVar30;
                        if (pCVar30 == (Curl_addrinfo *)0x0) {
                          if ((char)newurl == '\x01') {
                            Curl_failf(data,"Unix socket path too long: \'%s\'",pcVar20);
                          }
                          (*Curl_cfree)(pCVar29);
                          CVar17 = CURLE_OUT_OF_MEMORY;
                          if ((char)newurl != '\0') {
                            CVar17 = CURLE_COULDNT_RESOLVE_HOST;
                          }
                          goto switchD_00159d71_caseD_5;
                        }
                        pCVar29->refcount = 1;
                        conn_00->dns_entry = pCVar29;
                      }
                    }
                    else {
                      *local_50 = false;
                    }
                    pCVar24 = conn_00->handler;
                    (data->info).conn_scheme = pCVar24->scheme;
                    (data->info).conn_protocol = pCVar24->protocol & 0x3ffffff;
                    (data->info).field_0xe4 =
                         (data->info).field_0xe4 & 0xfd | *(byte *)&conn_00->bits >> 3 & 2;
                    CVar16 = Curl_conn_ev_data_setup(data);
                    goto LAB_0015b6c5;
                  }
                  uVar26 = 0;
LAB_0015b583:
                  if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x8cf & 1) != 0))
                  {
                    puVar1 = &(conn->bits).field_0x3;
                    *puVar1 = *puVar1 | 1;
                  }
                  if ((uVar26 & 1) != 0) goto LAB_0015b5ac;
                  iVar15 = Curl_cpool_check_limits(data,conn);
                  if (iVar15 == 2) {
                    uVar33 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
                    if (-1 < (data->set).dohfor_mid) {
                      if (((uVar33 >> 0x1c & 1) != 0) &&
                         ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 ||
                          (0 < pcVar31->log_level)))) {
                        Curl_infof(data,"Allowing DoH to override max connection limit");
                      }
                      goto LAB_0015b825;
                    }
                    if ((uVar33 >> 0x1c & 1) == 0) goto LAB_0015b5ac;
                    pcVar31 = (data->state).feat;
                    pcVar20 = "No connections available in cache";
                  }
                  else {
                    if (iVar15 != 1) {
LAB_0015b825:
                      CVar16 = Curl_ssl_conn_config_init(data,conn);
                      if (CVar16 == CURLE_OK) {
                        Curl_attach_connection(data,conn);
                        CVar16 = Curl_cpool_add_conn(data,conn);
                        if (CVar16 == CURLE_OK) {
                          if ((((data->state).authhost.picked & 8) != 0) &&
                             (bVar12 = (data->state).authhost.field_0x18, (bVar12 & 1) != 0)) {
                            if ((((data->set).field_0x8cd & 0x10) != 0) &&
                               ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 ||
                                (0 < pcVar31->log_level)))) {
                              Curl_infof(data,"NTLM picked AND auth done set, clear picked");
                              bVar12 = (data->state).authhost.field_0x18;
                            }
                            (data->state).authhost.picked = 0;
                            (data->state).authhost.field_0x18 = bVar12 & 0xfe;
                          }
                          conn_00 = conn;
                          if ((((data->state).authproxy.picked & 8) != 0) &&
                             (bVar12 = (data->state).authproxy.field_0x18, (bVar12 & 1) != 0)) {
                            if ((((data->set).field_0x8cd & 0x10) != 0) &&
                               ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 ||
                                (0 < pcVar31->log_level)))) {
                              Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
                              bVar12 = (data->state).authproxy.field_0x18;
                            }
                            (data->state).authproxy.picked = 0;
                            (data->state).authproxy.field_0x18 = bVar12 & 0xfe;
                          }
                          goto LAB_0015bb74;
                        }
                      }
                      goto LAB_00159f54;
                    }
                    if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_0015b5ac;
                    pcVar31 = (data->state).feat;
                    pcVar20 = "No more connections allowed to host";
                  }
                  if ((pcVar31 == (curl_trc_feat *)0x0) || (0 < pcVar31->log_level)) {
                    Curl_infof(data,pcVar20);
                  }
LAB_0015b5ac:
                  if ((((data->set).field_0x8cd & 0x10) != 0) &&
                     ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar31->log_level)))) {
                    Curl_infof(data,"No connections available.");
                  }
                  Curl_conn_free(data,conn);
                  return CURLE_NO_CONNECTION_AVAILABLE;
                }
                (data->info).conn_scheme = pCVar24->scheme;
                (data->info).conn_protocol = pCVar24->protocol & 0x3ffffff;
                CVar17 = (*pCVar24->connect_it)(data,(_Bool *)&newurl);
                if (CVar17 == CURLE_OK) {
                  Curl_attach_connection(data,conn);
                  CVar16 = Curl_cpool_add_conn(data,conn);
                  if (CVar16 == CURLE_OK) {
                    CVar16 = setup_range(data);
                    if (CVar16 == CURLE_OK) {
                      Curl_xfer_setup_nop(data);
                      goto LAB_0015b669;
                    }
                    (*conn->handler->done)(data,CVar16,false);
                  }
                }
                else {
LAB_0015b669:
                  Curl_init_do(data,conn);
                  CVar16 = CVar17;
                }
LAB_0015b6c5:
                if (CVar16 == CURLE_OK) {
                  sVar21 = Curl_llist_count(&conn->easyq);
                  if (1 < sVar21) {
                    *local_40 = true;
                    return CURLE_OK;
                  }
                  if (*local_50 != false) {
                    return CURLE_OK;
                  }
                  CVar16 = Curl_setup_conn(data,local_40);
                }
LAB_00159f54:
                CVar17 = CVar16;
                if (CVar16 == CURLE_NO_CONNECTION_AVAILABLE) {
                  return CURLE_NO_CONNECTION_AVAILABLE;
                }
                goto switchD_00159d71_caseD_5;
              default:
                goto switchD_0015a17a_caseD_6;
              case CURLUE_UNSUPPORTED_SCHEME:
                goto switchD_00159d71_caseD_5;
              case CURLUE_OUT_OF_MEMORY:
                break;
              case CURLUE_USER_NOT_ALLOWED:
                goto switchD_00159d71_caseD_8;
              }
            default:
              if (CVar14 != CURLUE_OK) goto switchD_0015a17a_caseD_6;
              pcVar20 = (*Curl_cstrdup)(*ppcVar2);
              conn->options = pcVar20;
              if (pcVar20 != (char *)0x0) goto switchD_0015a17a_caseD_d;
            }
            goto switchD_00159d71_caseD_7;
          }
        }
        pcVar38 = " (in redirect)";
        if (((data->state).field_0x744 & 2) == 0) {
          pcVar38 = "";
        }
        Curl_failf(data,"Protocol \"%s\" %s%s",pcVar20,pcVar41,pcVar38);
        goto switchD_00159d71_caseD_5;
      }
      local_58 = host;
      (*Curl_cfree)(part->scheme);
      part->scheme = (char *)0x0;
      CVar14 = curl_url_set(u,CURLUPART_SCHEME,"https",0);
      CVar16 = CURLE_URL_MALFORMAT;
      switch(CVar14) {
      case CURLUE_OK:
        if (((data->state).field_0x745 & 0x40) != 0) {
          (*Curl_cfree)((data->state).url);
          (data->state).url = (char *)0x0;
        }
        CVar14 = curl_url_get(u,CURLUPART_URL,&newurl,0);
        switch(CVar14) {
        case CURLUE_OK:
          CVar14 = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
          if (CVar14 == CURLUE_OK) {
            (data->state).url = newurl;
            puVar1 = &(data->state).field_0x745;
            *puVar1 = *puVar1 | 0x40;
            host = local_58;
            if ((((data->set).field_0x8cd & 0x10) != 0) &&
               ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 ||
                (0 < pcVar31->log_level)))) {
              Curl_infof(data,"Switched from HTTP to HTTPS due to HSTS => %s");
              host = local_58;
            }
            goto LAB_0015a0dc;
          }
          (*Curl_cfree)(newurl);
          if (CVar14 - CURLUE_UNSUPPORTED_SCHEME < 4) {
            CVar16 = *(CURLcode *)(&DAT_00175ab4 + (ulong)(CVar14 - CURLUE_UNSUPPORTED_SCHEME) * 4);
          }
          break;
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_00159ff9_caseD_5;
        case CURLUE_OUT_OF_MEMORY:
          goto switchD_00159ff9_caseD_7;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_00159ff9_caseD_8;
        }
        break;
      case CURLUE_UNSUPPORTED_SCHEME:
switchD_00159ff9_caseD_5:
        CVar16 = CURLE_UNSUPPORTED_PROTOCOL;
        break;
      case CURLUE_OUT_OF_MEMORY:
switchD_00159ff9_caseD_7:
        CVar16 = CURLE_OUT_OF_MEMORY;
        break;
      case CURLUE_USER_NOT_ALLOWED:
switchD_00159ff9_caseD_8:
        CVar16 = CURLE_LOGIN_DENIED;
      }
switchD_00159e6c_caseD_5:
      CVar17 = CVar16;
      goto switchD_00159d71_caseD_5;
    }
switchD_00159d71_caseD_7:
    CVar17 = CURLE_OUT_OF_MEMORY;
switchD_00159d71_caseD_5:
    if ((CVar17 != CURLE_OK) && (conn != (connectdata *)0x0)) {
      Curl_detach_connection(data);
      Curl_cpool_disconnect(data,conn,true);
    }
    return CVar17;
  default:
switchD_00159d71_caseD_1:
    CVar17 = CURLE_URL_MALFORMAT;
  case CURLUE_UNSUPPORTED_SCHEME:
    goto switchD_00159d71_caseD_5;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_00159d71_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
switchD_00159d71_caseD_8:
    CVar17 = CURLE_LOGIN_DENIED;
    goto switchD_00159d71_caseD_5;
  }
LAB_0015af28:
  bVar12 = *pbVar39;
  __s = pbVar39;
  if (bVar12 == 0) goto LAB_0015af72;
  if ((((9 < (byte)(bVar12 - 0x30)) && (0x19 < (byte)((bVar12 & 0xdf) + 0xbf))) &&
      (1 < bVar12 - 0x2d)) && ((bVar12 != 0x7e && (bVar12 != 0x5f)))) goto LAB_0015af65;
  pbVar39 = pbVar39 + 1;
  goto LAB_0015af28;
LAB_0015af65:
  if (bVar12 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
LAB_0015af72:
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 || (0 < pcVar31->log_level)))
       ) {
      Curl_infof(data,"Invalid IPv6 address format");
    }
  }
LAB_0015af9e:
  pcVar20 = strchr((char *)__s,0x3a);
  uVar26 = 0xffffffff;
  if (pcVar20 == (char *)0x0) {
LAB_0015affc:
    pcVar20 = (*Curl_cstrdup)((char *)local_90);
    CVar16 = CURLE_OK;
    if (pcVar20 == (char *)0x0) {
      CVar16 = CURLE_OUT_OF_MEMORY;
      goto LAB_0015b055;
    }
    bVar42 = true;
  }
  else {
    newurl = (char *)0x0;
    *pcVar20 = '\0';
    uVar26 = 0xffffffff;
    if (pcVar20[1] == '\0') goto LAB_0015affc;
    local_38 = pcVar20 + 1;
    uVar26 = strtol(local_38,&newurl,10);
    if (((newurl == (char *)0x0) || (*newurl == '\0')) && (uVar26 < 0x10000)) goto LAB_0015affc;
    Curl_failf(data,"No valid port number in connect to host string (%s)",local_38);
    CVar16 = CURLE_SETOPT_OPTION_SYNTAX;
LAB_0015b055:
    pcVar20 = (char *)0x0;
    uVar26 = 0xffffffff;
    bVar42 = false;
  }
  (*Curl_cfree)(local_60);
  if (!bVar42) goto LAB_0015b6c5;
  if (pcVar20 == (char *)0x0) {
    pcVar20 = (char *)0x0;
  }
  else if (*pcVar20 != '\0') {
    (conn->conn_to_host).rawalloc = pcVar20;
    (conn->conn_to_host).name = pcVar20;
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 | 1;
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 || (0 < pcVar31->log_level)))
       ) {
      Curl_infof(data,"Connecting to hostname: %s",pcVar20);
    }
    goto LAB_0015ae7f;
  }
LAB_0015ae68:
  puVar1 = &(conn->bits).field_0x1;
  *puVar1 = *puVar1 & 0xfe;
  (*Curl_cfree)(pcVar20);
  pcVar20 = (char *)0x0;
LAB_0015ae7f:
  if ((int)uVar26 < 0) {
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 & 0xfd;
  }
  else {
    conn->conn_to_port = (int)uVar26;
    puVar1 = &(conn->bits).field_0x1;
    *puVar1 = *puVar1 | 2;
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar31 = (data->state).feat, pcVar31 == (curl_trc_feat *)0x0 || (0 < pcVar31->log_level)))
       ) {
      Curl_infof(data,"Connecting to port: %d",uVar26 & 0xffffffff);
    }
  }
  local_a0 = &pcVar4->next;
  goto LAB_0015acbd;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* Set the request to virgin state based on transfer settings */
  Curl_req_hard_reset(&data->req, data);

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that is either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We are not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_cpool_disconnect(data, conn, TRUE);
  }

  return result;
}